

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2togif.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long lVar2;
  FILE *out;
  FILE *in;
  gdImagePtr im;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    fprintf(_stderr,"Usage: gd2togif filename.gd2 filename.gif\n");
    exit(1);
  }
  pFVar1 = fopen(argv[1],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Input file does not exist!\n");
    exit(1);
  }
  lVar2 = gdImageCreateFromGd2(pFVar1);
  fclose(pFVar1);
  if (lVar2 == 0) {
    fprintf(_stderr,"Input is not in GD2 format!\n");
    exit(1);
  }
  pFVar1 = fopen(argv[2],"wb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Output file cannot be written to!\n");
    gdImageDestroy(lVar2);
    exit(1);
  }
  gdImageGif(lVar2,pFVar1);
  fclose(pFVar1);
  gdImageDestroy(lVar2);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im;
	FILE *in, *out;
	if (argc != 3) {
		fprintf(stderr, "Usage: gd2togif filename.gd2 filename.gif\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im = gdImageCreateFromGd2(in);
	fclose(in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit(1);
	}
	out = fopen(argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy(im);
		exit(1);
	}
	gdImageGif(im, out);
	fclose(out);
	gdImageDestroy(im);

	return 0;
}